

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles31::Functional::IsinfCase::compare(IsinfCase *this,void **inputs,void **outputs)

{
  Precision PVar1;
  int iVar2;
  pointer pSVar3;
  uint uVar4;
  ostream *poVar5;
  ulong uVar6;
  ulong uVar7;
  Float<unsigned_short,_5,_10,_15,_3U> local_42;
  IsinfCase *local_40;
  HexBool local_34;
  
  pSVar3 = (this->super_CommonFunctionCase).m_spec.inputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  PVar1 = (pSVar3->varType).m_data.basic.precision;
  uVar4 = glu::getDataTypeScalarSize((pSVar3->varType).m_data.basic.type);
  if (PVar1 == PRECISION_HIGHP) {
    uVar7 = 0;
    uVar6 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar6 = uVar7;
    }
    for (; uVar6 != uVar7; uVar7 = uVar7 + 1) {
      uVar4 = *(uint *)((long)*inputs + uVar7 * 4) & 0x7fffffff;
      if ((*(int *)((long)*outputs + uVar7 * 4) == 0) == (uVar4 == 0x7f800000)) {
        poVar5 = std::operator<<(&(this->super_CommonFunctionCase).m_failMsg.
                                  super_basic_ostream<char,_std::char_traits<char>_>,"Expected [");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)uVar7);
        poVar5 = std::operator<<(poVar5,"] = ");
        local_34.value = (uint)(uVar4 == 0x7f800000);
        Functional::operator<<(poVar5,&local_34);
        return false;
      }
    }
  }
  else {
    if (PVar1 != PRECISION_MEDIUMP) {
      return true;
    }
    uVar7 = 0;
    uVar6 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar6 = uVar7;
    }
    local_40 = this;
    for (; uVar6 != uVar7; uVar7 = uVar7 + 1) {
      iVar2 = *(int *)((long)*outputs + uVar7 * 4);
      tcu::Float<unsigned_short,_5,_10,_15,_3U>::Float
                (&local_42,*(float *)((long)*inputs + uVar7 * 4));
      if (((local_42.m_value & 0x7fff) != 0x7c00) && (iVar2 != 0)) {
        poVar5 = std::operator<<(&(local_40->super_CommonFunctionCase).m_failMsg.
                                  super_basic_ostream<char,_std::char_traits<char>_>,"Expected [");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)uVar7);
        poVar5 = std::operator<<(poVar5,"] = ");
        std::operator<<(poVar5,"false");
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		if (precision == glu::PRECISION_HIGHP)
		{
			// Only highp is required to support inf/nan
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0		= ((const float*)inputs[0])[compNdx];
				const bool		out0	= ((const deUint32*)outputs[0])[compNdx] != 0;
				const bool		ref		= tcu::Float32(in0).isInf();

				if (out0 != ref)
				{
					m_failMsg << "Expected [" << compNdx << "] = " << HexBool(ref);
					return false;
				}
			}
		}
		else if (precision == glu::PRECISION_MEDIUMP)
		{
			// Inf support is optional, check that inputs that are not Inf in mediump don't result in true.
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0		= ((const float*)inputs[0])[compNdx];
				const bool		out0	= ((const deUint32*)outputs[0])[compNdx] != 0;
				const bool		ref		= tcu::Float16(in0).isInf();

				if (!ref && out0)
				{
					m_failMsg << "Expected [" << compNdx << "] = " << (ref ? "true" : "false");
					return false;
				}
			}
		}
		// else: no verification can be performed

		return true;
	}